

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

MPP_RET mpp_buffer_group_limit_config(MppBufferGroup group,size_t size,RK_S32 count)

{
  MppBufferGroupImpl *p;
  RK_S32 count_local;
  size_t size_local;
  MppBufferGroup group_local;
  
  if (group == (MppBufferGroup)0x0) {
    _mpp_log_l(2,"mpp_buffer","input invalid group %p\n","mpp_buffer_group_limit_config",0);
    group_local._4_4_ = MPP_NOK;
  }
  else {
    if ((*(int *)((long)group + 0x48) != 0) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->mode == MPP_BUFFER_INTERNAL","mpp_buffer_group_limit_config",0x1be),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    *(size_t *)((long)group + 0x68) = size;
    *(RK_S32 *)((long)group + 0x70) = count;
    group_local._4_4_ = MPP_OK;
  }
  return group_local._4_4_;
}

Assistant:

MPP_RET mpp_buffer_group_limit_config(MppBufferGroup group, size_t size, RK_S32 count)
{
    if (NULL == group) {
        mpp_err_f("input invalid group %p\n", group);
        return MPP_NOK;
    }

    MppBufferGroupImpl *p = (MppBufferGroupImpl *)group;
    mpp_assert(p->mode == MPP_BUFFER_INTERNAL);
    p->limit_size     = size;
    p->limit_count    = count;
    return MPP_OK;
}